

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void invokeProfileCallback(sqlite3 *db,Vdbe *p)

{
  long local_28;
  sqlite3_int64 iElapse;
  sqlite3_int64 iNow;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  iNow = (sqlite3_int64)p;
  p_local = (Vdbe *)db;
  sqlite3OsCurrentTimeInt64(db->pVfs,&iElapse);
  local_28 = (iElapse - *(long *)(iNow + 0xb8)) * 1000000;
  if (p_local->pFree != (void *)0x0) {
    (*(code *)p_local->pFree)(p_local->pFrame,*(undefined8 *)(iNow + 0xf8),local_28);
  }
  if (((ulong)p_local->aMem & 0x2000000000000) != 0) {
    (**(code **)(p_local->aCounter + 7))(2,p_local->zSql,iNow,&local_28);
  }
  *(undefined8 *)(iNow + 0xb8) = 0;
  return;
}

Assistant:

static SQLITE_NOINLINE void invokeProfileCallback(sqlite3 *db, Vdbe *p){
  sqlite3_int64 iNow;
  sqlite3_int64 iElapse;
  assert( p->startTime>0 );
  assert( (db->mTrace & (SQLITE_TRACE_PROFILE|SQLITE_TRACE_XPROFILE))!=0 );
  assert( db->init.busy==0 );
  assert( p->zSql!=0 );
  sqlite3OsCurrentTimeInt64(db->pVfs, &iNow);
  iElapse = (iNow - p->startTime)*1000000;
#ifndef SQLITE_OMIT_DEPRECATED
  if( db->xProfile ){
    db->xProfile(db->pProfileArg, p->zSql, iElapse);
  }
#endif
  if( db->mTrace & SQLITE_TRACE_PROFILE ){
    db->trace.xV2(SQLITE_TRACE_PROFILE, db->pTraceArg, p, (void*)&iElapse);
  }
  p->startTime = 0;
}